

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

uint32 BailOutRecord::BailOutFromLoopBodyInlinedCommon
                 (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,
                 uint32 bailOutOffset,void *returnAddress,BailOutKind bailOutKind,Var branchValue)

{
  uint32 bailOutOffset_00;
  code *pcVar1;
  ScriptFunction *bailOutRecord_00;
  bool bVar2;
  undefined4 *puVar3;
  ScriptFunction *function;
  ScriptFunction *innerMostInlinee_00;
  Var local_1e8;
  Var registerSaves [49];
  BailOutReturnValue bailOutReturnValue;
  ScriptFunction *innerMostInlinee;
  BailOutRecord *currentBailOutRecord;
  BailOutKind local_34;
  
  currentBailOutRecord = (BailOutRecord *)branchValue;
  if (bailOutRecord->parent == (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    local_34 = bailOutKind;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x4c7,"(bailOutRecord->parent != nullptr)",
                       "bailOutRecord->parent != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    bailOutKind = local_34;
  }
  js_memcpy_s(&local_1e8,0x188,
              *(void **)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)layout + 8) + 8) + 0x490)
                                  + 0x3b8) + 0xa80),0x188);
  bailOutReturnValue.returnValueRegSlot = 0;
  bailOutReturnValue._12_4_ = 0;
  innerMostInlinee = (ScriptFunction *)bailOutRecord;
  BailOutInlinedHelper
            (layout,(BailOutRecord **)&innerMostInlinee,bailOutOffset,returnAddress,bailOutKind,
             &local_1e8,(BailOutReturnValue *)(registerSaves + 0x30),
             (ScriptFunction **)&bailOutReturnValue.returnValueRegSlot,true,currentBailOutRecord);
  SetHasBailedOutBit(bailOutRecord,
                     *(ScriptContext **)(*(long *)(*(long *)(*(long *)layout + 8) + 8) + 0x490));
  bailOutRecord_00 = innerMostInlinee;
  bailOutOffset_00 = *(uint32 *)((long)&(innerMostInlinee->environment).ptr + 4);
  innerMostInlinee_00 = innerMostInlinee;
  BailOutFromLoopBodyHelper
            (layout,(BailOutRecord *)innerMostInlinee,bailOutOffset_00,bailOutKind,(Var)0x0,
             &local_1e8,(BailOutReturnValue *)(registerSaves + 0x30));
  function = Js::VarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  ScheduleLoopBodyCodeGen
            (function,innerMostInlinee_00,(BailOutRecord *)bailOutRecord_00,bailOutKind);
  return bailOutOffset_00;
}

Assistant:

uint32
BailOutRecord::BailOutFromLoopBodyInlinedCommon(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord,
    uint32 bailOutOffset, void * returnAddress, IR::BailOutKind bailOutKind, Js::Var branchValue)
{
    Assert(bailOutRecord->parent != nullptr);
    // This isn't strictly necessary if there's no allocations on this path, but because such an
    // issue would be hard to notice and introduce some significant issues, we can do this copy.
    // The problem from not doing this and then doing an allocation before RestoreValues is that
    // the GC doesn't check the BailOutRegisterSaveSpace.
    Js::Var registerSaves[BailOutRegisterSaveSlotCount];
    js_memcpy_s(registerSaves, sizeof(registerSaves), (Js::Var *)layout->functionObject->GetScriptContext()->GetThreadContext()->GetBailOutRegisterSaveSpace(),
        sizeof(registerSaves));
    BailOutRecord const * currentBailOutRecord = bailOutRecord;
    BailOutReturnValue bailOutReturnValue;
    Js::ScriptFunction * innerMostInlinee = nullptr;
    BailOutInlinedHelper(layout, currentBailOutRecord, bailOutOffset, returnAddress, bailOutKind, registerSaves, &bailOutReturnValue, &innerMostInlinee, true, branchValue);
    SetHasBailedOutBit(bailOutRecord, layout->functionObject->GetScriptContext());
    uint32 result = BailOutFromLoopBodyHelper(layout, currentBailOutRecord, currentBailOutRecord->bailOutOffset,
        bailOutKind, nullptr, registerSaves, &bailOutReturnValue);
    ScheduleLoopBodyCodeGen(Js::VarTo<Js::ScriptFunction>(layout->functionObject), innerMostInlinee, currentBailOutRecord, bailOutKind);
    return result;
}